

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

bool __thiscall DistanceGraph::remove_link(DistanceGraph *this,sgNodeID_t source,sgNodeID_t dest)

{
  anon_class_16_2_a2084240_for__M_pred __pred;
  anon_class_16_2_a2084240_for__M_pred __pred_00;
  reference this_00;
  size_type sVar1;
  reference this_01;
  size_type sVar2;
  size_type sVar3;
  __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_> *in_RDX;
  vector<Link,_std::allocator<Link>_> *in_RSI;
  const_iterator in_RDI;
  size_type dlinksLen;
  value_type *dlinks;
  size_type slinksLen;
  value_type *slinks;
  vector<Link,_std::allocator<Link>_> *in_stack_fffffffffffffef8;
  reference this_02;
  __normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_>
  *in_stack_ffffffffffffff00;
  const_iterator __first;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> in_stack_ffffffffffffff30;
  __normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> in_stack_ffffffffffffff38;
  bool local_1;
  
  __first._M_current = (Link *)&(in_RDI._M_current)->dest;
  if ((long)in_RSI < 1) {
    in_RSI = (vector<Link,_std::allocator<Link>_> *)-(long)in_RSI;
  }
  this_00 = std::
            vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
            ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                          *)__first._M_current,(size_type)in_RSI);
  sVar1 = std::vector<Link,_std::allocator<Link>_>::size(this_00);
  std::vector<Link,_std::allocator<Link>_>::begin(in_stack_fffffffffffffef8);
  std::vector<Link,_std::allocator<Link>_>::end(in_stack_fffffffffffffef8);
  __pred.dest = (sgNodeID_t)__first._M_current;
  __pred.source = (sgNodeID_t)in_RDI._M_current;
  std::
  remove_if<__gnu_cxx::__normal_iterator<Link*,std::vector<Link,std::allocator<Link>>>,DistanceGraph::remove_link(long,long)::__0>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__pred);
  __gnu_cxx::__normal_iterator<Link_const*,std::vector<Link,std::allocator<Link>>>::
  __normal_iterator<Link*>
            (in_stack_ffffffffffffff00,
             (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)
             in_stack_fffffffffffffef8);
  std::vector<Link,_std::allocator<Link>_>::end(in_stack_fffffffffffffef8);
  __gnu_cxx::__normal_iterator<Link_const*,std::vector<Link,std::allocator<Link>>>::
  __normal_iterator<Link*>
            (in_stack_ffffffffffffff00,
             (__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)
             in_stack_fffffffffffffef8);
  std::vector<Link,_std::allocator<Link>_>::erase(in_RSI,__first,in_RDI);
  if ((long)in_RDX < 1) {
    in_RDX = (__normal_iterator<const_Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)
             -(long)in_RDX;
  }
  this_01 = std::
            vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
            ::operator[]((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
                          *)&(in_RDI._M_current)->dest,(size_type)in_RDX);
  sVar2 = std::vector<Link,_std::allocator<Link>_>::size(this_01);
  this_02 = this_01;
  std::vector<Link,_std::allocator<Link>_>::begin(this_01);
  std::vector<Link,_std::allocator<Link>_>::end(this_02);
  __pred_00.dest = (sgNodeID_t)__first._M_current;
  __pred_00.source = (sgNodeID_t)in_RDI._M_current;
  std::
  remove_if<__gnu_cxx::__normal_iterator<Link*,std::vector<Link,std::allocator<Link>>>,DistanceGraph::remove_link(long,long)::__1>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,__pred_00);
  __gnu_cxx::__normal_iterator<Link_const*,std::vector<Link,std::allocator<Link>>>::
  __normal_iterator<Link*>
            (in_RDX,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)this_02)
  ;
  std::vector<Link,_std::allocator<Link>_>::end(this_02);
  __gnu_cxx::__normal_iterator<Link_const*,std::vector<Link,std::allocator<Link>>>::
  __normal_iterator<Link*>
            (in_RDX,(__normal_iterator<Link_*,_std::vector<Link,_std::allocator<Link>_>_> *)this_02)
  ;
  std::vector<Link,_std::allocator<Link>_>::erase(in_RSI,__first,in_RDI);
  sVar3 = std::vector<Link,_std::allocator<Link>_>::size(this_00);
  if ((sVar3 == sVar1) &&
     (sVar1 = std::vector<Link,_std::allocator<Link>_>::size(this_01), sVar1 == sVar2)) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DistanceGraph::remove_link(sgNodeID_t source, sgNodeID_t dest) {
    auto & slinks = links[(source > 0 ? source : -source)];
    auto slinksLen = slinks.size();
    slinks.erase(std::remove_if(slinks.begin(), slinks.end(), [source,dest] (auto l) {return l.source==source and l.dest==dest;}), slinks.end());
    auto & dlinks = links[(dest > 0 ? dest : -dest)];
    auto dlinksLen = dlinks.size();
    dlinks.erase(std::remove_if(dlinks.begin(), dlinks.end(), [source,dest] (auto l) {return l.source==dest and l.dest==source;}), dlinks.end());
    if (slinks.size() != slinksLen or dlinks.size() != dlinksLen) return true;
    return false;
}